

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *complexity)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT RVar8;
  int iVar9;
  REF_NODE pRVar10;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG ntet;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  *complexity = 0.0;
  uVar2 = ref_cell_ncell(ref_grid->cell[8],ref_node,&ntet);
  if (uVar2 == 0) {
    uVar2 = ref_cell_ncell(ref_grid->cell[9],ref_node,&npyr);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x769,"ref_metric_complexity",(ulong)uVar2,"count");
      return uVar2;
    }
    uVar2 = ref_cell_ncell(ref_grid->cell[10],ref_node,&npri);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x76a,"ref_metric_complexity",(ulong)uVar2,"count");
      return uVar2;
    }
    uVar2 = ref_cell_ncell(ref_grid->cell[0xb],ref_node,&nhex);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x76b,"ref_metric_complexity",(ulong)uVar2,"count");
      return uVar2;
    }
    lVar4 = npyr + ntet + npri;
    lVar5 = lVar4 + nhex;
    if (lVar5 == 0 || SCARRY8(lVar4,nhex) != lVar5 < 0) {
      pRVar1 = ref_grid->cell[3];
      pRVar10 = (REF_NODE)complexity;
      if (0 < pRVar1->max) {
        iVar9 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,iVar9,nodes);
          if ((RVar3 == 0) &&
             (uVar2 = ref_metric_sub_tri_complexity
                                (1,2,(REF_INT)nodes,(REF_INT *)metric,complexity,(REF_DBL *)ref_node
                                 ,pRVar10), complexity = (REF_DBL *)pRVar10,
             pRVar10 = (REF_NODE)complexity, uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x7a6,"ref_metric_complexity",(ulong)uVar2,"tri sub_tri");
            return uVar2;
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < pRVar1->max);
      }
      pRVar1 = ref_grid->cell[6];
      if (0 < pRVar1->max) {
        RVar8 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,RVar8,nodes);
          if ((RVar3 == 0) &&
             (uVar2 = ref_metric_sub_tri_complexity
                                (1,2,(REF_INT)nodes,(REF_INT *)metric,complexity,(REF_DBL *)ref_node
                                 ,pRVar10), complexity = (REF_DBL *)pRVar10,
             pRVar10 = (REF_NODE)complexity, uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x7ad,"ref_metric_complexity",(ulong)uVar2,"qua sub_tri");
            return uVar2;
          }
          RVar8 = RVar8 + 1;
        } while (RVar8 < pRVar1->max);
      }
      if (0 < pRVar1->max) {
        iVar9 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,iVar9,nodes);
          if ((RVar3 == 0) &&
             (uVar2 = ref_metric_sub_tri_complexity
                                (2,3,(REF_INT)nodes,(REF_INT *)metric,complexity,(REF_DBL *)ref_node
                                 ,pRVar10), complexity = (REF_DBL *)pRVar10,
             pRVar10 = (REF_NODE)complexity, uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x7b2,"ref_metric_complexity",(ulong)uVar2,"qua sub_tri");
            return uVar2;
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < pRVar1->max);
      }
    }
    else {
      pRVar1 = ref_grid->cell[8];
      pRVar10 = (REF_NODE)complexity;
      if (0 < pRVar1->max) {
        RVar8 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,RVar8,nodes);
          if ((RVar3 == 0) &&
             (uVar2 = ref_metric_sub_tet_complexity(0,1,2,3,nodes,metric,complexity,ref_node),
             complexity = (REF_DBL *)pRVar10, pRVar10 = (REF_NODE)complexity, uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x772,"ref_metric_complexity",(ulong)uVar2,"tet sub_tet");
            return uVar2;
          }
          RVar8 = RVar8 + 1;
        } while (RVar8 < pRVar1->max);
      }
      pRVar1 = ref_grid->cell[9];
      if (0 < pRVar1->max) {
        iVar9 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,iVar9,nodes);
          if (RVar3 == 0) {
            uVar2 = ref_metric_sub_tet_complexity(0,4,1,2,nodes,metric,complexity,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x779,"ref_metric_complexity",(ulong)uVar2,"pyr sub_tet");
              return uVar2;
            }
            complexity = (REF_DBL *)pRVar10;
            uVar2 = ref_metric_sub_tet_complexity(0,3,4,2,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            pRVar10 = (REF_NODE)complexity;
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x77c,"ref_metric_complexity",(ulong)uVar2,"pyr sub_tet");
              return uVar2;
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < pRVar1->max);
      }
      pRVar1 = ref_grid->cell[10];
      if (0 < pRVar1->max) {
        RVar8 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,RVar8,nodes);
          if (RVar3 == 0) {
            uVar2 = ref_metric_sub_tet_complexity(0,4,5,3,nodes,metric,complexity,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x783,"ref_metric_complexity",(ulong)uVar2,"pri sub_tet");
              return uVar2;
            }
            uVar2 = ref_metric_sub_tet_complexity(0,1,5,4,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x786,"ref_metric_complexity",(ulong)uVar2,"pri sub_tet");
              return uVar2;
            }
            complexity = (REF_DBL *)pRVar10;
            uVar2 = ref_metric_sub_tet_complexity(0,1,2,5,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            pRVar10 = (REF_NODE)complexity;
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x789,"ref_metric_complexity",(ulong)uVar2,"pri sub_tet");
              return uVar2;
            }
          }
          RVar8 = RVar8 + 1;
        } while (RVar8 < pRVar1->max);
      }
      pRVar1 = ref_grid->cell[0xb];
      if (0 < pRVar1->max) {
        iVar9 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,iVar9,nodes);
          if (RVar3 == 0) {
            uVar2 = ref_metric_sub_tet_complexity(0,5,7,4,nodes,metric,complexity,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x790,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
              return uVar2;
            }
            uVar2 = ref_metric_sub_tet_complexity(0,1,7,5,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x793,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
              return uVar2;
            }
            uVar2 = ref_metric_sub_tet_complexity(1,6,7,5,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x796,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
              return uVar2;
            }
            uVar2 = ref_metric_sub_tet_complexity(0,7,2,3,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x799,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
              return uVar2;
            }
            uVar2 = ref_metric_sub_tet_complexity(0,7,1,2,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x79c,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
              return uVar2;
            }
            complexity = (REF_DBL *)pRVar10;
            uVar2 = ref_metric_sub_tet_complexity(1,7,6,2,nodes,metric,(REF_DBL *)pRVar10,ref_node);
            pRVar10 = (REF_NODE)complexity;
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x79f,"ref_metric_complexity",(ulong)uVar2,"hex sub_tet");
              return uVar2;
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < pRVar1->max);
      }
    }
    uVar2 = ref_mpi_allsum(ref_grid->mpi,complexity,1,3);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar7 = "dbl sum";
    uVar6 = 0x7b7;
  }
  else {
    pcVar7 = "count";
    uVar6 = 0x768;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
         "ref_metric_complexity",(ulong)uVar2,pcVar7);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                         REF_DBL *complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL have_vol_cells;
  REF_LONG ntet, npyr, npri, nhex;
  *complexity = 0.0;
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "count");
  RSS(ref_cell_ncell(ref_grid_pyr(ref_grid), ref_node, &npyr), "count");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "count");
  RSS(ref_cell_ncell(ref_grid_hex(ref_grid), ref_node, &nhex), "count");
  have_vol_cells = (0 < ntet + npyr + npri + nhex);
  if (have_vol_cells) {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 1, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "tet sub_tet");
    }

    ref_cell = ref_grid_pyr(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 4, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "pyr sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 3, 4, 2, nodes, metric, complexity,
                                        ref_node),
          "pyr sub_tet");
    }

    ref_cell = ref_grid_pri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 4, 5, 3, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 5, 4, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 2, 5, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
    }

    ref_cell = ref_grid_hex(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 5, 7, 4, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 7, 5, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(1, 6, 7, 5, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 7, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 7, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(1, 7, 6, 2, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
    }
  } else {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "tri sub_tri");
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "qua sub_tri");
    }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "qua sub_tri");
    }
  }

  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), complexity, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}